

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

char * el::base::utils::Str::convertAndAddToBuff
                 (size_t n,int len,char *buf,char *bufLim,bool zeroPadded)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *pcVar4;
  char *local_40;
  char *p;
  char local_2c;
  char localBuff [10];
  bool zeroPadded_local;
  char *bufLim_local;
  char *buf_local;
  size_t sStack_10;
  int len_local;
  size_t n_local;
  
  localBuff[2] = zeroPadded;
  unique0x100000f6 = bufLim;
  memset((void *)((long)&p + 5),0,10);
  local_40 = localBuff;
  buf_local._4_4_ = len;
  sStack_10 = n;
  if (n == 0) {
    local_40 = &local_2c;
    local_2c = '0';
    buf_local._4_4_ = len + -1;
  }
  else {
    while( true ) {
      bVar1 = false;
      if ((sStack_10 != 0) && (bVar1 = false, (char *)((long)&p + 5U) < local_40)) {
        bVar1 = 0 < buf_local._4_4_;
      }
      if (!bVar1) break;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = sStack_10;
      local_40[-1] = SUB161(auVar2 % ZEXT816(10),0) + '0';
      sStack_10 = sStack_10 / 10;
      buf_local._4_4_ = buf_local._4_4_ + -1;
      local_40 = local_40 + -1;
    }
  }
  if ((localBuff[2] & 1U) != 0) {
    while( true ) {
      iVar3 = buf_local._4_4_;
      bVar1 = (char *)((long)&p + 5U) < local_40;
      if (bVar1) {
        buf_local._4_4_ = buf_local._4_4_ + -1;
      }
      if (!bVar1 || iVar3 < 1) break;
      local_40[-1] = '0';
      local_40 = local_40 + -1;
    }
  }
  pcVar4 = addToBuff(local_40,buf,stack0xffffffffffffffd8);
  return pcVar4;
}

Assistant:

static inline char* convertAndAddToBuff(std::size_t n, int len, char* buf, const char* bufLim, bool zeroPadded = true) {
        char localBuff[10] = "";
        char* p = localBuff + sizeof(localBuff) - 2;
        if (n > 0) {
            for (; n > 0 && p > localBuff && len > 0; n /= 10, --len)
                *--p = static_cast<char>(n % 10 + '0');
        } else {
            *--p = '0';
            --len;
        }
        if (zeroPadded)
            while (p > localBuff && len-- > 0) *--p = static_cast<char>('0');
        return addToBuff(p, buf, bufLim);
    }